

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

int get_weapon_skill(CHAR_DATA *ch,int sn)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  int skill;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int local_10;
  
  bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (bVar1) {
    if (in_ESI == -1) {
      local_10 = *(short *)(in_RDI + 0x138) * 3;
    }
    else {
      if (in_ESI == gsn_hand_to_hand) {
        local_10 = *(short *)(in_RDI + 0x138) * 2;
      }
      else {
        local_10 = (*(short *)(in_RDI + 0x138) * 5) / 2;
      }
      local_10 = local_10 + 0x28;
    }
  }
  else if (in_ESI == -1) {
    local_10 = *(short *)(in_RDI + 0x138) * 3;
  }
  else {
    local_10 = (int)*(short *)(*(long *)(in_RDI + 0xc0) + 1000 + (long)in_ESI * 2);
  }
  if (local_10 < 0) {
    local_10 = 0;
  }
  else if (100 < local_10) {
    local_10 = 100;
  }
  return local_10;
}

Assistant:

int get_weapon_skill(CHAR_DATA *ch, int sn)
{
	int skill;

	/* -1 is exotic */
	if (is_npc(ch))
	{
		if (sn == -1)
			skill = 3 * ch->level;
		else if (sn == gsn_hand_to_hand)
			skill = 40 + 2 * ch->level;
		else
			skill = 40 + 5 * ch->level / 2;
	}
	else
	{
		if (sn == -1)
			skill = 3 * ch->level;
		else
			skill = ch->pcdata->learned[sn];
	}

	return URANGE(0, skill, 100);
}